

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O2

char * StateToString(pyhanabi_state_t *state)

{
  char *pcVar1;
  string str;
  string local_30;
  
  if (state == (pyhanabi_state_t *)0x0) {
    __assert_fail("state != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                  ,0x1e4,"char *StateToString(pyhanabi_state_t *)");
  }
  if ((HanabiState *)state->state != (HanabiState *)0x0) {
    hanabi_learning_env::HanabiState::ToString_abi_cxx11_(&local_30,(HanabiState *)state->state);
    pcVar1 = strdup(local_30._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_30);
    return pcVar1;
  }
  __assert_fail("state->state != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                ,0x1e5,"char *StateToString(pyhanabi_state_t *)");
}

Assistant:

char* StateToString(pyhanabi_state_t* state) {
  REQUIRE(state != nullptr);
  REQUIRE(state->state != nullptr);
  std::string str =
      reinterpret_cast<hanabi_learning_env::HanabiState*>(state->state)
          ->ToString();
  return strdup(str.c_str());
}